

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::initTest
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  _tests *this_00;
  pointer *pp_Var1;
  iterator iVar2;
  uint input_patch_size;
  GLuint GVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  _test_descriptor test_tcs_tes_4;
  _test_descriptor test_tes_max_patch_vertices_mul_4;
  _test_descriptor test_tes_half_max_patch_vertices_mul_4;
  _test_descriptor test_tes_4;
  _test_descriptor test_tcs_tes_max_patch_vertices_mul_4;
  _test_descriptor test_tcs_tes_half_max_patch_vertices_mul_4;
  string local_e0;
  _test_descriptor local_bc;
  _test_descriptor local_a0;
  _test_descriptor local_84;
  _test_descriptor local_68;
  _test_descriptor local_4c;
  long lVar9;
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    (**(code **)(lVar9 + 0x708))(1,&this->m_vao_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xef2);
    (**(code **)(lVar9 + 0xd8))(this->m_vao_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xef5);
    (**(code **)(lVar9 + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,
               &this->m_gl_max_patch_vertices_value);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv() for GL_MAX_PATCH_VERTICES_EXT pname failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xefa);
    uVar7 = this->m_gl_max_patch_vertices_value;
    uVar6 = (int)uVar7 / 2;
    uVar8 = uVar6 + 3;
    if (-1 < (int)uVar7 / 2) {
      uVar8 = uVar6;
    }
    input_patch_size = (uVar8 & 0xfffffffc) + 4;
    if (uVar6 == (uVar8 & 0xfffffffc)) {
      input_patch_size = uVar6;
    }
    if ((uVar7 & 3) != 0) {
      uVar8 = uVar7 + 3;
      if (-1 < (int)uVar7) {
        uVar8 = uVar7;
      }
      uVar7 = uVar8 & 0xfffffffc;
    }
    local_e0._M_dataplus._M_p._4_4_ = 0;
    local_e0._M_string_length._0_4_ = 0;
    local_e0._M_string_length._4_4_ = 0;
    local_e0.field_2._M_allocated_capacity._0_4_ = 0;
    local_e0.field_2._4_8_ = 0;
    local_e0._M_dataplus._M_p._0_4_ = 2;
    local_4c.vs_id = 0;
    local_4c.input_patch_size = 0;
    local_4c.fs_id = 0;
    local_4c.po_id = 0;
    local_4c.tcs_id = 0;
    local_4c.tes_id = 0;
    local_4c.type = TESSELLATION_TEST_TYPE_COUNT;
    local_68.vs_id = 0;
    local_68.input_patch_size = 0;
    local_68.fs_id = 0;
    local_68.po_id = 0;
    local_68.tcs_id = 0;
    local_68.tes_id = 0;
    local_68.type = TESSELLATION_TEST_TYPE_COUNT;
    local_84.vs_id = 0;
    local_84.input_patch_size = 0;
    local_84.fs_id = 0;
    local_84.po_id = 0;
    local_84.tcs_id = 0;
    local_84.tes_id = 0;
    local_84.type = TESSELLATION_TEST_TYPE_COUNT;
    local_a0.vs_id = 0;
    local_a0.input_patch_size = 0;
    local_a0.fs_id = 0;
    local_a0.po_id = 0;
    local_a0.tcs_id = 0;
    local_a0.tes_id = 0;
    local_a0.type = TESSELLATION_TEST_TYPE_COUNT;
    local_bc.vs_id = 0;
    local_bc.input_patch_size = 0;
    local_bc.fs_id = 0;
    local_bc.po_id = 0;
    local_bc.tcs_id = 0;
    local_bc.tes_id = 0;
    local_bc.type = TESSELLATION_TEST_TYPE_COUNT;
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,(_test_descriptor *)&local_e0,4);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&local_4c,input_patch_size);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&local_68,uVar7);
    uVar8 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar8 & 0x300) != 0) {
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&local_84,4);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&local_a0,input_patch_size);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&local_bc,uVar7);
    }
    this_00 = &this->m_tests;
    iVar2._M_current =
         (this->m_tests).
         super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
      ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const&>
                ((vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
                  *)this_00,iVar2,(_test_descriptor *)&local_e0);
    }
    else {
      (iVar2._M_current)->tcs_id = local_e0._M_string_length._4_4_;
      (iVar2._M_current)->tes_id = local_e0.field_2._0_4_;
      (iVar2._M_current)->vs_id = local_e0.field_2._4_4_;
      (iVar2._M_current)->input_patch_size = local_e0.field_2._8_4_;
      (iVar2._M_current)->type = local_e0._M_dataplus._M_p._0_4_;
      (iVar2._M_current)->fs_id = local_e0._M_dataplus._M_p._4_4_;
      (iVar2._M_current)->po_id = (undefined4)local_e0._M_string_length;
      (iVar2._M_current)->tcs_id = local_e0._M_string_length._4_4_;
      pp_Var1 = &(this->m_tests).
                 super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    iVar2._M_current =
         (this->m_tests).
         super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
      ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const&>
                ((vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
                  *)this_00,iVar2,&local_4c);
    }
    else {
      (iVar2._M_current)->tcs_id = local_4c.tcs_id;
      (iVar2._M_current)->tes_id = local_4c.tes_id;
      (iVar2._M_current)->vs_id = local_4c.vs_id;
      (iVar2._M_current)->input_patch_size = local_4c.input_patch_size;
      (iVar2._M_current)->type = local_4c.type;
      (iVar2._M_current)->fs_id = local_4c.fs_id;
      (iVar2._M_current)->po_id = local_4c.po_id;
      (iVar2._M_current)->tcs_id = local_4c.tcs_id;
      pp_Var1 = &(this->m_tests).
                 super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    iVar2._M_current =
         (this->m_tests).
         super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
      ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const&>
                ((vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
                  *)this_00,iVar2,&local_68);
    }
    else {
      GVar3 = local_68.tcs_id;
      (iVar2._M_current)->tcs_id = local_68.tcs_id;
      (iVar2._M_current)->tes_id = local_68.tes_id;
      (iVar2._M_current)->vs_id = local_68.vs_id;
      (iVar2._M_current)->input_patch_size = local_68.input_patch_size;
      (iVar2._M_current)->type = local_68.type;
      (iVar2._M_current)->fs_id = local_68.fs_id;
      (iVar2._M_current)->po_id = local_68.po_id;
      (iVar2._M_current)->tcs_id = GVar3;
      pp_Var1 = &(this->m_tests).
                 super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    uVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar7 & 0x300) != 0) {
      iVar2._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_tests).
          super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
        ::
        _M_realloc_insert<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const&>
                  ((vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
                    *)this_00,iVar2,&local_84);
      }
      else {
        (iVar2._M_current)->tcs_id = local_84.tcs_id;
        (iVar2._M_current)->tes_id = local_84.tes_id;
        (iVar2._M_current)->vs_id = local_84.vs_id;
        (iVar2._M_current)->input_patch_size = local_84.input_patch_size;
        (iVar2._M_current)->type = local_84.type;
        (iVar2._M_current)->fs_id = local_84.fs_id;
        (iVar2._M_current)->po_id = local_84.po_id;
        (iVar2._M_current)->tcs_id = local_84.tcs_id;
        pp_Var1 = &(this->m_tests).
                   super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      iVar2._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_tests).
          super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
        ::
        _M_realloc_insert<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const&>
                  ((vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
                    *)this_00,iVar2,&local_a0);
      }
      else {
        (iVar2._M_current)->tcs_id = local_a0.tcs_id;
        (iVar2._M_current)->tes_id = local_a0.tes_id;
        (iVar2._M_current)->vs_id = local_a0.vs_id;
        (iVar2._M_current)->input_patch_size = local_a0.input_patch_size;
        (iVar2._M_current)->type = local_a0.type;
        (iVar2._M_current)->fs_id = local_a0.fs_id;
        (iVar2._M_current)->po_id = local_a0.po_id;
        (iVar2._M_current)->tcs_id = local_a0.tcs_id;
        pp_Var1 = &(this->m_tests).
                   super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      iVar2._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_tests).
          super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
        ::
        _M_realloc_insert<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_const&>
                  ((vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>>
                    *)this_00,iVar2,&local_bc);
      }
      else {
        (iVar2._M_current)->tcs_id = local_bc.tcs_id;
        (iVar2._M_current)->tes_id = local_bc.tes_id;
        (iVar2._M_current)->vs_id = local_bc.vs_id;
        (iVar2._M_current)->input_patch_size = local_bc.input_patch_size;
        (iVar2._M_current)->type = local_bc.type;
        (iVar2._M_current)->fs_id = local_bc.fs_id;
        (iVar2._M_current)->po_id = local_bc.po_id;
        (iVar2._M_current)->tcs_id = local_bc.tcs_id;
        pp_Var1 = &(this->m_tests).
                   super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
    }
    (**(code **)(lVar9 + 0x6c8))(1,&this->m_bo_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glGenBuffers() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xf34);
    (**(code **)(lVar9 + 0x40))(0x8c8e,this->m_bo_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glBindBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xf37);
    (**(code **)(lVar9 + 0x48))(0x8c8e,0,this->m_bo_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"glBindBufferBase() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xf39);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_e0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTCTEgl_PatchVerticesIn::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_PATCH_VERTICES_EXT value before we carry on */
	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &m_gl_max_patch_vertices_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_PATCH_VERTICES_EXT pname failed");

	/* Initialize test descriptors.
	 *
	 * Make sure the values we use are multiples of 4 - this is because we're using isolines in the
	 * tessellation stage, and in order to have the requested amount of line segments generated, we need
	 * to use a multiply of 4 vertices per patch */
	glw::GLint n_half_max_patch_vertices_mul_4 = m_gl_max_patch_vertices_value / 2;
	glw::GLint n_max_patch_vertices_mul_4	  = m_gl_max_patch_vertices_value;

	if ((n_half_max_patch_vertices_mul_4 % 4) != 0)
	{
		/* Round to nearest mul-of-4 integer */
		n_half_max_patch_vertices_mul_4 += (4 - (m_gl_max_patch_vertices_value / 2) % 4);
	}

	if ((n_max_patch_vertices_mul_4 % 4) != 0)
	{
		/* Round to previous nearest mul-of-4 integer */
		n_max_patch_vertices_mul_4 -= (m_gl_max_patch_vertices_value % 4);
	}

	_test_descriptor test_tcs_tes_4;
	_test_descriptor test_tcs_tes_half_max_patch_vertices_mul_4;
	_test_descriptor test_tcs_tes_max_patch_vertices_mul_4;
	_test_descriptor test_tes_4;
	_test_descriptor test_tes_half_max_patch_vertices_mul_4;
	_test_descriptor test_tes_max_patch_vertices_mul_4;

	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_4, 4);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_half_max_patch_vertices_mul_4,
					   n_half_max_patch_vertices_mul_4);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_max_patch_vertices_mul_4,
					   n_max_patch_vertices_mul_4);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_4, 4);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_half_max_patch_vertices_mul_4,
						   n_half_max_patch_vertices_mul_4);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_max_patch_vertices_mul_4, n_max_patch_vertices_mul_4);
	}

	m_tests.push_back(test_tcs_tes_4);
	m_tests.push_back(test_tcs_tes_half_max_patch_vertices_mul_4);
	m_tests.push_back(test_tcs_tes_max_patch_vertices_mul_4);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_tests.push_back(test_tes_4);
		m_tests.push_back(test_tes_half_max_patch_vertices_mul_4);
		m_tests.push_back(test_tes_max_patch_vertices_mul_4);
	}

	/* Generate and set up a buffer object we will use to hold XFBed data.
	 *
	 * NOTE: We do not set the buffer object's storage here because its size
	 *       is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* We're good to execute the test! */
}